

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetImplementation.hpp
# Opt level: O0

void __thiscall
SCSI::Target::Target<SCSI::DirectAccessDevice>::send_status(Target<SCSI::DirectAccessDevice> *this)

{
  continuation *in_RDX;
  Status in_ESI;
  
  send_status((Target<SCSI::DirectAccessDevice> *)&this[-1].next_function_._M_invoker,in_ESI,in_RDX)
  ;
  return;
}

Assistant:

void Target<Executor>::send_status(Status status, continuation next) {
	// Status phase: message reset, control and input set.
	bus_state_ &= ~(Line::Control | Line::Input | Line::Message);
	bus_state_ |= Line::Input | Line::Control;

	status_ = status;
	phase_ = Phase::SendingStatus;
	next_function_ = next;

	data_pointer_ = 0;
	set_device_output(bus_state_);
}